

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitByBoneCountProcess.cpp
# Opt level: O2

void __thiscall
Assimp::SplitByBoneCountProcess::UpdateNode(SplitByBoneCountProcess *this,aiNode *pNode)

{
  pointer pvVar1;
  pointer __src;
  pointer puVar2;
  uint uVar3;
  uint *puVar4;
  uint a;
  ulong uVar5;
  uint a_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newMeshList;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  uVar3 = pNode->mNumMeshes;
  if (uVar3 != 0) {
    local_48._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar5 = 0; puVar4 = pNode->mMeshes, uVar5 < uVar3; uVar5 = uVar5 + 1) {
      pvVar1 = (this->mSubMeshIndices).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,
                 (const_iterator)local_48._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )pvVar1[puVar4[uVar5]].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )*(pointer *)
                    ((long)&pvVar1[puVar4[uVar5]].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data + 8));
      uVar3 = pNode->mNumMeshes;
    }
    if (puVar4 != (uint *)0x0) {
      operator_delete__(puVar4);
    }
    puVar2 = local_48._M_impl.super__Vector_impl_data._M_finish;
    __src = local_48._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)local_48._M_impl.super__Vector_impl_data._M_finish -
            (long)local_48._M_impl.super__Vector_impl_data._M_start;
    pNode->mNumMeshes = (uint)(uVar5 >> 2);
    puVar4 = (uint *)operator_new__(uVar5 & 0x3fffffffc);
    pNode->mMeshes = puVar4;
    if (puVar2 != __src) {
      memmove(puVar4,__src,uVar5);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  }
  for (uVar5 = 0; uVar5 < pNode->mNumChildren; uVar5 = uVar5 + 1) {
    UpdateNode(this,pNode->mChildren[uVar5]);
  }
  return;
}

Assistant:

void SplitByBoneCountProcess::UpdateNode( aiNode* pNode) const
{
    // rebuild the node's mesh index list
    if( pNode->mNumMeshes > 0 )
    {
        std::vector<unsigned int> newMeshList;
        for( unsigned int a = 0; a < pNode->mNumMeshes; ++a)
        {
            unsigned int srcIndex = pNode->mMeshes[a];
            const std::vector<unsigned int>& replaceMeshes = mSubMeshIndices[srcIndex];
            newMeshList.insert( newMeshList.end(), replaceMeshes.begin(), replaceMeshes.end());
        }

        delete [] pNode->mMeshes;
        pNode->mNumMeshes = static_cast<unsigned int>(newMeshList.size());
        pNode->mMeshes = new unsigned int[pNode->mNumMeshes];
        std::copy( newMeshList.begin(), newMeshList.end(), pNode->mMeshes);
    }

    // do that also recursively for all children
    for( unsigned int a = 0; a < pNode->mNumChildren; ++a )
    {
        UpdateNode( pNode->mChildren[a]);
    }
}